

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O2

string * __thiscall
glcts::DrawBuffersIndexedBlending::GenFS_abi_cxx11_
          (string *__return_storage_ptr__,DrawBuffersIndexedBlending *this,int maxDrawBuffers)

{
  ostream *poVar1;
  int i;
  int i_1;
  int iVar2;
  ostringstream os;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<(&local_1a8,
                  "#version 300 es                        \nprecision highp float;                 \nprecision highp int;                   \n"
                 );
  iVar2 = 0;
  if (maxDrawBuffers < 1) {
    maxDrawBuffers = 0;
  }
  for (; maxDrawBuffers != iVar2; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"\nlayout(location = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1,") out vec4 color");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,";");
  }
  for (iVar2 = 0; maxDrawBuffers != iVar2; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"\nuniform vec4 c");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,";");
  }
  std::operator<<(&local_1a8,"\nvoid main() {");
  for (iVar2 = 0; maxDrawBuffers != iVar2; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"\n    color");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1," = c");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,";");
  }
  std::operator<<(&local_1a8,"\n}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawBuffersIndexedBlending::GenFS(int maxDrawBuffers)
{
	std::ostringstream os;
	os << "#version 300 es                        \n"
		  "precision highp float;                 \n"
		  "precision highp int;                   \n";

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		os << "\nlayout(location = " << i << ") out vec4 color" << i << ";";
	}
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		os << "\nuniform vec4 c" << i << ";";
	}

	os << "\nvoid main() {";

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		os << "\n    color" << i << " = c" << i << ";";
	}

	os << "\n}";
	return os.str();
}